

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterOperations.cpp
# Opt level: O0

shared_ptr<helics::FilterOperator> __thiscall
helics::FirewallFilterOperation::getOperator(FirewallFilterOperation *this)

{
  shared_ptr<helics::FirewallOperator> *in_RDI;
  shared_ptr<helics::FilterOperator> sVar1;
  
  sVar1 = std::static_pointer_cast<helics::FilterOperator,helics::FirewallOperator>(in_RDI);
  sVar1.super___shared_ptr<helics::FilterOperator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)in_RDI;
  return (shared_ptr<helics::FilterOperator>)
         sVar1.super___shared_ptr<helics::FilterOperator,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<FilterOperator> FirewallFilterOperation::getOperator()
{
    return std::static_pointer_cast<FilterOperator>(op);
}